

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  allocator<char> local_c1;
  cmListFileParser local_c0;
  
  bVar1 = cmsys::SystemTools::FileExists(filename);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,filename,&local_c1);
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)&local_c0);
    if (local_c0.ListFile !=
        (cmListFile *)
        &local_c0.Backtrace.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount) {
      operator_delete(local_c0.ListFile,
                      (ulong)((long)&(local_c0.Backtrace.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if (!bVar1) {
      local_c0.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lfbt->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c0.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (lfbt->TopEntry).
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_c0.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c0.Backtrace.TopEntry.
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c0.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c0.Backtrace.TopEntry.
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c0.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_c0.ListFile = this;
      local_c0.Messenger = messenger;
      local_c0.FileName = filename;
      local_c0.Lexer = cmListFileLexer_New();
      local_c0.Function.super_cmCommandContext.Name.Lower._M_dataplus._M_p =
           (pointer)&local_c0.Function.super_cmCommandContext.Name.Lower.field_2;
      local_c0.Function.super_cmCommandContext.Name.Lower._M_string_length = 0;
      local_c0.Function.super_cmCommandContext.Name.Lower.field_2._M_local_buf[0] = '\0';
      local_c0.Function.super_cmCommandContext.Name.Original._M_dataplus._M_p =
           (pointer)&local_c0.Function.super_cmCommandContext.Name.Original.field_2;
      local_c0.Function.super_cmCommandContext.Name.Original._M_string_length = 0;
      local_c0.Function.super_cmCommandContext.Name.Original.field_2._M_local_buf[0] = '\0';
      local_c0.Function.super_cmCommandContext.Line = 0;
      local_c0.Function.Arguments.
      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c0.Function.Arguments.
      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c0.Function.Arguments.
      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = cmListFileParser::ParseFile(&local_c0);
      cmListFileParser::~cmListFileParser(&local_c0);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger, filename);
    parseError = !parser.ParseFile();
  }

  return !parseError;
}